

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O0

DHANDLE dino_config_start_http
                  (char *application_name,char *host,_Bool enable_logging,char *function,char *file,
                  int line)

{
  undefined4 *puVar1;
  dino_string_ptr pdVar2;
  dino_http_site_t *dino_site;
  int line_local;
  char *file_local;
  char *function_local;
  _Bool enable_logging_local;
  char *host_local;
  char *application_name_local;
  
  set_application_name(application_name);
  set_log_mode(enable_logging);
  log_message(6,function,file,line,"Config Start with host %s.",host);
  puVar1 = (undefined4 *)memory_alloc(0x18);
  if (puVar1 != (undefined4 *)0x0) {
    pdVar2 = dino_string_new_with_str(host);
    *(dino_string_ptr *)(puVar1 + 4) = pdVar2;
    *(undefined2 *)(puVar1 + 1) = 0x50;
    *(undefined8 *)(puVar1 + 2) = 0;
    *puVar1 = 1;
  }
  return puVar1;
}

Assistant:

DHANDLE DINO_EXPORT dino_config_start_http(const char *application_name, const char *host, bool enable_logging,
                                           const char *function, const char *file, int line) {
    set_application_name(application_name);
    set_log_mode(enable_logging);

    log_message(LOG_INFO, function, file, line, "Config Start with host %s.", host);

    dino_http_site_t *dino_site = (dino_http_site_t *) memory_alloc(sizeof(dino_http_site_t));
    if (NULL != dino_site) {

        dino_site->host = dino_string_new_with_str(host);
        dino_site->port = 80;
        dino_site->list = NULL;
        dino_site->handle_type = dino_handle_site;
    }

    return dino_site;
}